

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

void __thiscall Gluco::SimpSolver::SimpSolver(SimpSolver *this)

{
  ClauseAllocator *this_00;
  CRef CVar1;
  vec<Gluco::Lit> dummy;
  
  Solver::Solver(&this->super_Solver);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_00a8b060;
  this->grow = opt_grow.value;
  this->clause_lim = opt_clause_lim.value;
  this->subsumption_lim = opt_subsumption_lim.value;
  this->simp_garbage_frac = opt_simp_garbage_frac.value;
  this->use_asymm = opt_use_asymm.value;
  this->use_rcheck = opt_use_rcheck.value;
  this->use_elim = opt_use_elim.value;
  this->merges = 0;
  this->asymm_lits = 0;
  this->eliminated_vars = 0;
  this->eliminated_clauses = 0;
  this->elimorder = 1;
  this->use_simplification = true;
  this_00 = &(this->super_Solver).ca;
  (this->elimclauses).data = (uint *)0x0;
  (this->elimclauses).sz = 0;
  (this->elimclauses).cap = 0;
  (this->touched).data = (char *)0x0;
  (this->touched).sz = 0;
  (this->touched).cap = 0;
  (this->occurs).occs.data = (vec<unsigned_int> *)0x0;
  (this->occurs).occs.sz = 0;
  (this->occurs).occs.cap = 0;
  (this->occurs).dirty.data = (char *)0x0;
  (this->occurs).dirty.sz = 0;
  (this->occurs).dirty.cap = 0;
  (this->occurs).dirties.data = (int *)0x0;
  (this->occurs).dirties.sz = 0;
  (this->occurs).dirties.cap = 0;
  (this->occurs).deleted.ca = this_00;
  (this->n_occ).data = (int *)0x0;
  (this->n_occ).sz = 0;
  (this->n_occ).cap = 0;
  (this->elim_heap).lt.n_occ = &this->n_occ;
  (this->elim_heap).heap.data = (int *)0x0;
  (this->elim_heap).heap.sz = 0;
  (this->elim_heap).heap.cap = 0;
  (this->elim_heap).indices.data = (int *)0x0;
  (this->elim_heap).indices.sz = 0;
  (this->elim_heap).indices.cap = 0;
  Queue<unsigned_int>::Queue(&this->subsumption_queue);
  (this->eliminated).data = (char *)0x0;
  (this->eliminated).sz = 0;
  (this->eliminated).cap = 0;
  (this->frozen).data = (char *)0x0;
  (this->frozen).sz = 0;
  (this->frozen).cap = 0;
  this->bwdsub_assigns = 0;
  this->n_touched = 0;
  vec<Gluco::Lit>::vec(&dummy,1,(Lit *)&lit_Undef);
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 1;
  CVar1 = ClauseAllocator::alloc<Gluco::vec<Gluco::Lit>>(this_00,&dummy,false);
  this->bwdsub_tmpunit = CVar1;
  (this->super_Solver).remove_satisfied = false;
  vec<Gluco::Lit>::~vec(&dummy);
  return;
}

Assistant:

SimpSolver::SimpSolver() :
    grow               (opt_grow)
  , clause_lim         (opt_clause_lim)
  , subsumption_lim    (opt_subsumption_lim)
  , simp_garbage_frac  (opt_simp_garbage_frac)
  , use_asymm          (opt_use_asymm)
  , use_rcheck         (opt_use_rcheck)
  , use_elim           (opt_use_elim)
  , merges             (0)
  , asymm_lits         (0)
  , eliminated_vars    (0)
  , eliminated_clauses (0)
  , elimorder          (1)
  , use_simplification (true)
  , occurs             (ClauseDeleted(ca))
  , elim_heap          (ElimLt(n_occ))
  , bwdsub_assigns     (0)
  , n_touched          (0)
{
    vec<Lit> dummy(1,lit_Undef);
    ca.extra_clause_field = true; // NOTE: must happen before allocating the dummy clause below.
    bwdsub_tmpunit        = ca.alloc(dummy);
    remove_satisfied      = false;
}